

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void report_volume_text(pa_sink_info *i)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  
  if (i->mute != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"muted\n",6);
    return;
  }
  uVar2 = (ulong)(i->volume).channels;
  if (uVar2 == 0) {
    dVar6 = 0.0;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar1 = (i->volume).values[uVar4];
      if (uVar5 < uVar1) {
        uVar5 = uVar1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    dVar6 = (double)uVar5 * 100.0 * 1.52587890625e-05;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%\n",2);
  return;
}

Assistant:

void report_volume_text(const pa_sink_info *i) {
    if (i->mute) {
        cout << "muted\n";
    } else {
        // Use volume of the channel with the greatest value
        uint32_t volume = get_max_volume(i);
        cout << 100. * float(volume) / PA_VOLUME_NORM << "%\n";
    }
}